

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_integrate_pdf<trng::weibull_dist<long_double>>
               (weibull_dist<long_double> *d)

{
  StringRef capturedExpression;
  undefined1 x [16];
  undefined1 x_00 [16];
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  undefined1 x_01 [16];
  ushort uVar1;
  longlong *plVar2;
  int iVar3;
  ushort in_FPUControlWord;
  longdouble lVar4;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar6;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double __x;
  double __x_00;
  AssertionHandler catchAssertionHandler;
  result_type tol;
  result_type s;
  int i;
  vector<long_double,_std::allocator<long_double>_> y;
  result_type dx;
  result_type x_max;
  result_type x_min;
  int samples;
  undefined4 uVar7;
  Flags resultDisposition;
  undefined4 uVar8;
  undefined2 uVar9;
  undefined6 in_stack_fffffffffffffe12;
  StringRef *in_stack_fffffffffffffe18;
  AssertionHandler *this;
  undefined1 *puVar10;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 uVar11;
  undefined6 uVar12;
  undefined2 in_stack_fffffffffffffe3e;
  unkbyte10 in_stack_fffffffffffffe40;
  undefined2 in_stack_fffffffffffffe4a;
  weibull_dist<long_double> *this_00;
  undefined4 in_stack_fffffffffffffe60;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
  in_stack_fffffffffffffe68;
  undefined2 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe72 [14];
  weibull_dist<long_double> *in_stack_fffffffffffffe88;
  AssertionHandler local_130;
  longdouble local_c8;
  longdouble *local_b8;
  longdouble *local_b0;
  longdouble local_a8;
  int local_74;
  undefined1 local_70 [24];
  longdouble local_58;
  longdouble local_38;
  weibull_dist<long_double> *local_20;
  longlong local_18;
  int local_c;
  
  local_18 = 0x100000;
  std::numeric_limits<long_double>::epsilon();
  __x_00 = std::sqrt(__x);
  lVar5 = in_ST7;
  lVar6 = in_ST7;
  std::round(__x_00);
  uVar1 = in_FPUControlWord | 0xc00;
  this_00 = (weibull_dist<long_double> *)(long)ROUND(in_ST2);
  local_20 = this_00;
  plVar2 = std::min<long_long>(&local_18,(longlong *)&local_20);
  local_c = (int)*plVar2;
  x._10_2_ = in_stack_fffffffffffffe4a;
  x._0_10_ = in_stack_fffffffffffffe40;
  x._12_2_ = uVar1;
  x._14_2_ = in_FPUControlWord;
  trng::weibull_dist<long_double>::icdf(this_00,(result_type_conflict3)x);
  uVar7 = (undefined4)_DAT_00468380;
  resultDisposition = (Flags)((unkuint10)_DAT_00468380 >> 0x20);
  uVar9 = (undefined2)((unkuint10)_DAT_00468380 >> 0x40);
  x_00._10_2_ = in_stack_fffffffffffffe4a;
  x_00._0_10_ = in_stack_fffffffffffffe40;
  x_00._12_2_ = uVar1;
  x_00._14_2_ = in_FPUControlWord;
  local_38 = in_ST3;
  trng::weibull_dist<long_double>::icdf(this_00,(result_type_conflict3)x_00);
  local_58 = (in_ST4 - local_38) / (longdouble)local_c;
  iVar3 = local_c;
  std::vector<long_double,_std::allocator<long_double>_>::vector
            ((vector<long_double,_std::allocator<long_double>_> *)0x373c45);
  for (local_74 = 0; local_74 <= local_c; local_74 = local_74 + 1) {
    lVar4 = local_58 * (longdouble)local_74 + local_38;
    uVar7 = SUB104(lVar4,0);
    resultDisposition = (Flags)((unkuint10)lVar4 >> 0x20);
    uVar9 = (undefined2)((unkuint10)lVar4 >> 0x40);
    x_01._2_14_ = in_stack_fffffffffffffe72;
    x_01._0_2_ = in_stack_fffffffffffffe70;
    in_ST5 = in_ST6;
    in_ST6 = in_ST7;
    in_ST7 = lVar5;
    lVar5 = lVar6;
    trng::weibull_dist<long_double>::pdf(in_stack_fffffffffffffe88,(result_type_conflict3)x_01);
    std::vector<long_double,_std::allocator<long_double>_>::push_back
              ((vector<long_double,_std::allocator<long_double>_> *)
               CONCAT62(in_stack_fffffffffffffe12,uVar9),
               (value_type_conflict7 *)CONCAT44(resultDisposition,uVar7));
  }
  puVar10 = local_70;
  local_b0 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::begin
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(resultDisposition,uVar7));
  local_b8 = (longdouble *)
             std::vector<long_double,_std::allocator<long_double>_>::end
                       ((vector<long_double,_std::allocator<long_double>_> *)
                        CONCAT44(resultDisposition,uVar7));
  last._M_current._4_4_ = iVar3;
  last._M_current._0_4_ = in_stack_fffffffffffffe60;
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            (in_stack_fffffffffffffe68,last);
  uVar11 = SUB104(in_ST5,0);
  uVar12 = (undefined6)((unkuint10)in_ST5 >> 0x20);
  local_a8 = local_58 * in_ST5;
  local_c8 = ((longdouble)64.0 / (longdouble)local_c) / (longdouble)local_c;
  local_130.m_assertionInfo.lineInfo =
       (SourceLineInfo)
       operator____catch_sr
                 ((char *)CONCAT62(in_stack_fffffffffffffe12,uVar9),
                  CONCAT44(resultDisposition,uVar7));
  this = &local_130;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0x94);
  Catch::StringRef::StringRef((StringRef *)this,(char *)in_stack_fffffffffffffe18);
  iVar3 = (int)&local_130 + 0x20;
  capturedExpression.m_size._0_4_ = in_stack_fffffffffffffe30;
  capturedExpression.m_start = puVar10;
  capturedExpression.m_size._4_4_ = uVar11;
  Catch::AssertionHandler::AssertionHandler
            (this,in_stack_fffffffffffffe18,
             (SourceLineInfo *)CONCAT62(in_stack_fffffffffffffe12,uVar9),capturedExpression,
             resultDisposition);
  lVar5 = _DAT_00468390 + local_a8;
  uVar7 = SUB104(lVar5,0);
  uVar8 = (undefined4)((unkuint10)lVar5 >> 0x20);
  uVar9 = (undefined2)((unkuint10)lVar5 >> 0x40);
  std::abs(iVar3);
  Catch::Decomposer::operator<=((Decomposer *)CONCAT44(uVar8,uVar7),(longdouble *)0x373e1c);
  Catch::ExprLhs<long_double_const&>::operator<
            ((ExprLhs<const_long_double_&> *)CONCAT26(in_stack_fffffffffffffe3e,uVar12),
             (longdouble *)CONCAT44(uVar11,in_stack_fffffffffffffe30));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar9),
             (ITransientExpression *)CONCAT44(uVar8,uVar7));
  Catch::BinaryExpr<const_long_double_&,_const_long_double_&>::~BinaryExpr
            ((BinaryExpr<const_long_double_&,_const_long_double_&> *)0x373e73);
  Catch::AssertionHandler::complete((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar9));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT62(in_stack_fffffffffffffe12,uVar9));
  std::vector<long_double,_std::allocator<long_double>_>::~vector
            ((vector<long_double,_std::allocator<long_double>_> *)this);
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}